

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m2v_LU_mult(m2v *LU,int *rp,int *cp,m2v *X,m2v *Y_out)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  m2v_base *pmVar5;
  m2v_base *pmVar6;
  m2v_base *pmVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  
  if (0 < Y_out->n_row) {
    iVar9 = 0;
    do {
      iVar2 = Y_out->row_stride;
      if (0 < iVar2) {
        pmVar5 = Y_out->e;
        lVar17 = 0;
        do {
          pmVar5[(ulong)(uint)(iVar2 * iVar9) + lVar17] = 0;
          lVar17 = lVar17 + 1;
        } while (lVar17 < Y_out->row_stride);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < Y_out->n_row);
  }
  uVar16 = LU->n_row;
  if (0 < (int)uVar16) {
    lVar17 = 0;
    do {
      if (lVar17 < LU->n_col) {
        iVar9 = rp[lVar17];
        pmVar5 = LU->e;
        lVar18 = (long)LU->n_col;
        do {
          lVar11 = lVar18 + -1;
          uVar16 = (uint)lVar11;
          uVar10 = uVar16 + 0x1f;
          if (-1 < (int)uVar16) {
            uVar10 = uVar16;
          }
          if (((pmVar5[((int)uVar10 >> 5) + LU->row_stride * (int)lVar17] >> (uVar16 & 0x1f) & 1) !=
               0) && (iVar2 = Y_out->row_stride, 0 < (long)iVar2)) {
            iVar3 = cp[lVar18 + -1];
            iVar4 = X->row_stride;
            pmVar6 = X->e;
            pmVar7 = Y_out->e;
            lVar18 = 0;
            do {
              pmVar7[(long)iVar2 * (long)iVar9 + lVar18] =
                   pmVar7[(long)iVar2 * (long)iVar9 + lVar18] ^
                   pmVar6[(long)iVar4 * (long)iVar3 + lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 < Y_out->row_stride);
          }
          lVar18 = lVar11;
        } while (lVar17 < lVar11);
      }
      lVar17 = lVar17 + 1;
      uVar16 = LU->n_row;
    } while (lVar17 < (int)uVar16);
  }
  if (0 < (int)uVar16) {
    uVar10 = uVar16 - 2;
    uVar13 = (ulong)uVar16;
    do {
      uVar12 = (ulong)uVar10;
      uVar14 = uVar13 - 1;
      iVar9 = LU->n_col;
      if ((long)iVar9 < (long)uVar13) {
        if (0 < iVar9) {
          pmVar5 = LU->e;
          lVar17 = (long)iVar9;
          do {
            uVar16 = (uint)(lVar17 + -1);
            uVar15 = uVar16 + 0x1f;
            if (-1 < (int)uVar16) {
              uVar15 = uVar16;
            }
            if (((pmVar5[((int)uVar15 >> 5) + LU->row_stride * (int)uVar14] >> (uVar16 & 0x1f) & 1)
                 != 0) && (lVar18 = (long)Y_out->row_stride, 0 < lVar18)) {
              iVar9 = rp[lVar17 + -1];
              iVar2 = rp[uVar14];
              pmVar6 = Y_out->e;
              lVar11 = 0;
              do {
                puVar1 = pmVar6 + iVar2 * lVar18 + lVar11;
                *puVar1 = *puVar1 ^ pmVar6[iVar9 * lVar18 + lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 < Y_out->row_stride);
            }
            bVar8 = 1 < lVar17;
            lVar17 = lVar17 + -1;
          } while (bVar8);
        }
      }
      else if (1 < (long)uVar13) {
        pmVar5 = LU->e;
        do {
          uVar16 = (uint)uVar12;
          if (((pmVar5[(int)(((uint)(uVar12 >> 5) & 0x7ffffff) + LU->row_stride * (int)uVar14)] >>
                (uVar16 & 0x1f) & 1) != 0) && (lVar17 = (long)Y_out->row_stride, 0 < lVar17)) {
            iVar9 = rp[uVar12];
            iVar2 = rp[uVar14];
            pmVar6 = Y_out->e;
            lVar18 = 0;
            do {
              puVar1 = pmVar6 + iVar2 * lVar17 + lVar18;
              *puVar1 = *puVar1 ^ pmVar6[iVar9 * lVar17 + lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 < Y_out->row_stride);
          }
          uVar12 = uVar12 - 1;
        } while (0 < (int)uVar16);
      }
      uVar10 = uVar10 - 1;
      bVar8 = 1 < (long)uVar13;
      uVar13 = uVar14;
    } while (bVar8);
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_mult)(const MV_GEN_TYPE* LU,
		   const int* rp,
		   const int* cp,
		   const MV_GEN_TYPE* X,
		   MV_GEN_TYPE* Y_out)
{
	/* Check dimensions */
	assert(LU->n_col == X->n_row);
	assert(LU->n_row == Y_out->n_row);
	assert(X->n_col == Y_out->n_col);

	/* Clear out the rows in the target vector */
	for (int i = 0; i < Y_out->n_row; ++i) {
		MV_GEN_N(_clear_row)(Y_out, i);
	}

	/* Multiply with U */
	for (int i = 0; i < LU->n_row; ++i) {
		const int t = rp[i];
		for (int j = LU->n_col - 1; j >= i; --j) {
			MV_GEN_N(_multadd_row)(X, cp[j],
					MV_GEN_N(_get_el)(LU, i, j),
					Y_out, t);
		}
	}

	/* Multiply with L */
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		}
	}
}